

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::showListView(QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  
  QAbstractButton::setDown(&((this->qFileDialogUi).d)->listModeButton->super_QAbstractButton,true);
  QAbstractButton::setDown
            (&((this->qFileDialogUi).d)->detailModeButton->super_QAbstractButton,false);
  QWidget::hide((QWidget *)((this->qFileDialogUi).d)->treeView);
  QWidget::show((QWidget *)((this->qFileDialogUi).d)->listView);
  pUVar1 = (this->qFileDialogUi).d;
  QStackedWidget::setCurrentWidget
            (pUVar1->stackedWidget,
             *(QWidget **)
              (*(long *)&(pUVar1->listView->super_QListView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8 + 0x10));
  (**(code **)(*(long *)&(((this->qFileDialogUi).d)->listView->super_QListView).
                         super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x220))();
  return;
}

Assistant:

void QFileDialogPrivate::showListView()
{
    qFileDialogUi->listModeButton->setDown(true);
    qFileDialogUi->detailModeButton->setDown(false);
    qFileDialogUi->treeView->hide();
    qFileDialogUi->listView->show();
    qFileDialogUi->stackedWidget->setCurrentWidget(qFileDialogUi->listView->parentWidget());
    qFileDialogUi->listView->doItemsLayout();
}